

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswmcpl.c
# Opt level: O0

int ssw2mcpl2(char *sswfile,char *mcplfile,int opt_dp,int opt_surf,int opt_gzip,char *inputdeckfile)

{
  char *pcVar1;
  size_t sVar2;
  char *__needle;
  ssw_particle_t *psVar3;
  undefined1 *__ptr;
  int in_ECX;
  int in_EDX;
  undefined8 in_RSI;
  int in_R8D;
  long in_R9;
  int did_gzip;
  char *actual_filename;
  size_t laf;
  char *tmp;
  ssw_particle_t *p;
  mcpl_particle_t mcpl_particle;
  uint64_t cfgfile_lbuf;
  char *cfgfile_buf;
  char *buf;
  size_t lstrbuf;
  mcpl_outfile_t mcplfh;
  ssw_file_t f;
  ssw_file_t in_stack_fffffffffffffed8;
  ssw_file_t in_stack_fffffffffffffee0;
  char *in_stack_fffffffffffffef0;
  char *in_stack_fffffffffffffef8;
  char *in_stack_ffffffffffffff00;
  int local_ec;
  ssw_file_t in_stack_ffffffffffffff18;
  double local_c8 [4];
  double local_a8;
  double local_a0;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  int local_68;
  undefined4 local_64;
  ulong local_60;
  char *local_58;
  char *local_50;
  ulong local_48;
  undefined8 local_40;
  ssw_file_t local_38;
  long local_30;
  int local_24;
  int local_20;
  int local_1c;
  undefined8 local_18;
  
  local_30 = in_R9;
  local_24 = in_R8D;
  local_20 = in_ECX;
  local_1c = in_EDX;
  local_18 = in_RSI;
  local_38 = ssw_open_file(in_stack_ffffffffffffff18.internal);
  local_40 = mcpl_create_outfile(local_18);
  pcVar1 = ssw_mcnpflavour(in_stack_fffffffffffffed8);
  mcpl_hdr_set_srcname(local_40,pcVar1);
  local_48 = 0x400;
  pcVar1 = ssw_srcname(local_38);
  sVar2 = strlen(pcVar1);
  local_48 = sVar2 + local_48;
  pcVar1 = ssw_srcversion(local_38);
  sVar2 = strlen(pcVar1);
  local_48 = sVar2 + local_48;
  pcVar1 = ssw_title(local_38);
  sVar2 = strlen(pcVar1);
  local_48 = sVar2 + local_48;
  if (local_48 < 0x1000) {
    local_50 = (char *)malloc(local_48);
    if (local_50 == (char *)0x0) {
      ssw_error((char *)0x104cd5);
    }
    *local_50 = '\0';
    ssw_strcat(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,(size_t)in_stack_fffffffffffffef0
              );
    in_stack_fffffffffffffef0 = local_50;
    ssw_mcnpflavour(in_stack_fffffffffffffed8);
    ssw_strcat(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,(size_t)in_stack_fffffffffffffef0
              );
    ssw_strcat(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,(size_t)in_stack_fffffffffffffef0
              );
    mcpl_hdr_add_comment(local_40,local_50);
    *local_50 = '\0';
    ssw_strcat(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,(size_t)in_stack_fffffffffffffef0
              );
    in_stack_fffffffffffffef8 = local_50;
    ssw_srcname(local_38);
    ssw_strcat(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,(size_t)in_stack_fffffffffffffef0
              );
    ssw_strcat(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,(size_t)in_stack_fffffffffffffef0
              );
    in_stack_ffffffffffffff00 = local_50;
    ssw_srcversion(local_38);
    ssw_strcat(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,(size_t)in_stack_fffffffffffffef0
              );
    ssw_strcat(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,(size_t)in_stack_fffffffffffffef0
              );
    ssw_title(local_38);
    ssw_strcat(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,(size_t)in_stack_fffffffffffffef0
              );
    ssw_strcat(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,(size_t)in_stack_fffffffffffffef0
              );
    mcpl_hdr_add_comment(local_40);
    free(local_50);
  }
  else {
    mcpl_hdr_add_comment(local_40);
  }
  if (local_20 != 0) {
    mcpl_hdr_add_comment(local_40);
    mcpl_enable_userflags(local_40);
  }
  if (local_1c != 0) {
    mcpl_enable_doubleprec(local_40);
  }
  if (local_30 != 0) {
    mcpl_read_file_to_buffer(local_30,0x6400000,1,&local_60,&local_58);
    pcVar1 = local_58;
    __needle = ssw_title(local_38);
    pcVar1 = strstr(pcVar1,__needle);
    if (pcVar1 == (char *)0x0) {
      pcVar1 = ssw_title(local_38);
      printf("Error: specified configuration file %s does not contain title found in ssw file: \"%s\".\n"
             ,local_30,pcVar1);
      return 0;
    }
    mcpl_hdr_add_data(local_40,"mcnp_input_deck",local_60 & 0xffffffff,local_58);
    free(local_58);
  }
  memset(local_c8,0,0x68);
  while (psVar3 = ssw_load_particle(in_stack_ffffffffffffff18), psVar3 != (ssw_particle_t *)0x0) {
    local_68 = (int)psVar3->pdgcode;
    if (local_68 == 0) {
      printf("Warning: ignored particle with no PDG code set (raw ssw type was %li).\n",
             psVar3->rawtype);
    }
    else {
      local_a8 = psVar3->x;
      local_a0 = psVar3->y;
      local_98 = psVar3->z;
      local_90 = psVar3->dirx;
      local_88 = psVar3->diry;
      local_80 = psVar3->dirz;
      local_78 = psVar3->time * 1e-05;
      local_70 = psVar3->weight;
      local_c8[0] = psVar3->ekin;
      local_64 = (undefined4)psVar3->isurf;
      mcpl_add_particle(local_40,local_c8);
    }
  }
  pcVar1 = (char *)mcpl_outfile_filename(local_40);
  sVar2 = strlen(pcVar1);
  __ptr = (undefined1 *)malloc(sVar2 + 1);
  if (__ptr == (undefined1 *)0x0) {
    ssw_error((char *)0x105135);
  }
  *__ptr = 0;
  ssw_strcat(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,(size_t)in_stack_fffffffffffffef0);
  local_ec = 0;
  if (local_24 == 0) {
    mcpl_close_outfile(local_40);
  }
  else {
    local_ec = mcpl_closeandgzip_outfile(local_40);
  }
  ssw_close_file(in_stack_fffffffffffffee0);
  pcVar1 = "";
  if (local_ec != 0) {
    pcVar1 = ".gz";
  }
  printf("Created %s%s\n",__ptr,pcVar1);
  free(__ptr);
  return 1;
}

Assistant:

int ssw2mcpl2(const char * sswfile, const char * mcplfile,
              int opt_dp, int opt_surf, int opt_gzip,
              const char * inputdeckfile)
{
  ssw_file_t f = ssw_open_file(sswfile);
  mcpl_outfile_t mcplfh = mcpl_create_outfile(mcplfile);
  mcpl_hdr_set_srcname(mcplfh,ssw_mcnpflavour(f));

  size_t lstrbuf = 1024;
  lstrbuf += strlen(ssw_srcname(f));
  lstrbuf += strlen(ssw_srcversion(f));
  lstrbuf += strlen(ssw_title(f));
  if (lstrbuf<4096) {
    char * buf = (char*)malloc(lstrbuf);
    if (!buf)
      ssw_error("memory allocation failure");
    buf[0] = '\0';
    ssw_strcat(buf,"SSW file from ",lstrbuf);
    ssw_strcat(buf,ssw_mcnpflavour(f),lstrbuf);
    ssw_strcat(buf," converted with ssw2mcpl",lstrbuf);
    mcpl_hdr_add_comment(mcplfh,buf);

    buf[0] = '\0';
    ssw_strcat(buf,"SSW metadata: [kods='",lstrbuf);
    ssw_strcat(buf,ssw_srcname(f),lstrbuf);
    ssw_strcat(buf,"', vers='",lstrbuf);
    ssw_strcat(buf,ssw_srcversion(f),lstrbuf);
    ssw_strcat(buf,"', title='",lstrbuf);
    ssw_strcat(buf,ssw_title(f),lstrbuf);
    ssw_strcat(buf,"']",lstrbuf);
    mcpl_hdr_add_comment(mcplfh,buf);
    free(buf);
  } else {
    mcpl_hdr_add_comment(mcplfh,"SSW metadata: <too long so not stored>");
  }
  if (opt_surf) {
    mcpl_hdr_add_comment(mcplfh,"The userflags in this file are the surface IDs found in the SSW file");
    mcpl_enable_userflags(mcplfh);
  }
  if (opt_dp) {
    mcpl_enable_doubleprec(mcplfh);
  }

  if (inputdeckfile) {
    char* cfgfile_buf;
    uint64_t cfgfile_lbuf;
    mcpl_read_file_to_buffer( inputdeckfile,
                              104857600,//100mb is beyond enough and within than
                                        //32bit integer reach.
                              1,//must be text
                              &cfgfile_lbuf,
                              &cfgfile_buf );
    /* if (!sswmcpl_file2buf(inputdeckfile, &cfgfile_buf, &cfgfile_lbuf, 104857600, 1)) */
    /*   return 0; */
    if (!strstr((const char*)cfgfile_buf, ssw_title(f))) {
      printf("Error: specified configuration file %s does not contain title"
             " found in ssw file: \"%s\".\n",inputdeckfile,ssw_title(f));
      return 0;
    }
    mcpl_hdr_add_data(mcplfh, "mcnp_input_deck",
                      (uint32_t)cfgfile_lbuf,
                      cfgfile_buf);
    free(cfgfile_buf);
  }

  mcpl_particle_t mcpl_particle;
  memset(&mcpl_particle,0,sizeof(mcpl_particle));

  while ( 1 ) {
    const ssw_particle_t * p = ssw_load_particle(f);
    if (!p)
      break;
    mcpl_particle.pdgcode = p->pdgcode;
    if (!mcpl_particle.pdgcode) {
      printf("Warning: ignored particle with no PDG code set (raw ssw type was %li).\n",p->rawtype);
      continue;
    }

    mcpl_particle.position[0] = p->x;//already in cm
    mcpl_particle.position[1] = p->y;//already in cm
    mcpl_particle.position[2] = p->z;//already in cm
    mcpl_particle.direction[0] = p->dirx;
    mcpl_particle.direction[1] = p->diry;
    mcpl_particle.direction[2] = p->dirz;
    mcpl_particle.time = p->time * 1.0e-5;//"shakes" to milliseconds
    mcpl_particle.weight = p->weight;
    mcpl_particle.ekin = p->ekin;//already in MeV
    mcpl_particle.userflags = p->isurf;

    mcpl_add_particle(mcplfh,&mcpl_particle);

  }

  const char * tmp = mcpl_outfile_filename(mcplfh);
  size_t laf = strlen(tmp);
  char * actual_filename = malloc(laf+1);
  if (!actual_filename)
    ssw_error("memory allocation failure");
  actual_filename[0]='\0';
  ssw_strcat(actual_filename,tmp,laf+1);

  int did_gzip = 0;
  if (opt_gzip)
    did_gzip = mcpl_closeandgzip_outfile(mcplfh);
  else
    mcpl_close_outfile(mcplfh);
  ssw_close_file(f);

  printf("Created %s%s\n",actual_filename,(did_gzip?".gz":""));
  free(actual_filename);
  return 1;
}